

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_multi_simple_var
              (secp256k1_gej *r,secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,
              void *cbdata,size_t n_points)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  secp256k1_gej *r_00;
  bool bVar4;
  code *pcVar5;
  secp256k1_ge *psVar6;
  ecmult_multi_data *data;
  byte bVar7;
  secp256k1_scalar scalar;
  secp256k1_gej pointj;
  secp256k1_gej tmpj;
  secp256k1_fe aux [4];
  secp256k1_ge point;
  secp256k1_ge pre_a [4];
  secp256k1_strauss_point_state ps [1];
  secp256k1_scalar local_86c;
  code *local_868;
  secp256k1_strauss_state local_860;
  secp256k1_gej local_848;
  secp256k1_gej local_7b0;
  secp256k1_fe local_718 [4];
  secp256k1_ge local_650;
  secp256k1_ge local_5e8 [4];
  secp256k1_strauss_point_state local_448;
  
  bVar7 = 0;
  secp256k1_gej_set_infinity(r);
  secp256k1_gej_set_infinity(&local_7b0);
  local_848.x.n[0] = (uint64_t)local_718;
  local_848.x.n[1] = (uint64_t)local_5e8;
  local_848.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_848,r,1,&local_7b0,&secp256k1_scalar_zero,inp_g_sc);
  local_868 = cb + 8;
  lVar2 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    local_86c = *(secp256k1_scalar *)(cb + lVar2 * 4);
    pcVar5 = local_868 + lVar2 * 0x68;
    psVar6 = &local_650;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      (psVar6->x).n[0] = *(uint64_t *)pcVar5;
      pcVar5 = pcVar5 + (ulong)bVar7 * -0x10 + 8;
      psVar6 = (secp256k1_ge *)((long)psVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    r_00 = &local_848;
    secp256k1_gej_set_ge(r_00,&local_650);
    local_860.aux = local_718;
    local_860.pre_a = local_5e8;
    local_860.ps = &local_448;
    secp256k1_ecmult_strauss_wnaf(&local_860,&local_7b0,1,r_00,&local_86c,(secp256k1_scalar *)0x0);
    secp256k1_gej_add_var(r,r,&local_7b0,&r_00->x);
    lVar2 = 1;
    bVar1 = false;
  } while (bVar4);
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_simple_var(secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points) {
    size_t point_idx;
    secp256k1_gej tmpj;

    secp256k1_gej_set_infinity(r);
    secp256k1_gej_set_infinity(&tmpj);
    /* r = inp_g_sc*G */
    secp256k1_ecmult(r, &tmpj, &secp256k1_scalar_zero, inp_g_sc);
    for (point_idx = 0; point_idx < n_points; point_idx++) {
        secp256k1_ge point;
        secp256k1_gej pointj;
        secp256k1_scalar scalar;
        if (!cb(&scalar, &point, point_idx, cbdata)) {
            return 0;
        }
        /* r += scalar*point */
        secp256k1_gej_set_ge(&pointj, &point);
        secp256k1_ecmult(&tmpj, &pointj, &scalar, NULL);
        secp256k1_gej_add_var(r, r, &tmpj, NULL);
    }
    return 1;
}